

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Unate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fVerbose;
  uint fComputeAll;
  char *pcVar3;
  
  fComputeAll = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"avh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 0x61) {
      Abc_Print(-2,"usage: &unate [-avh]\n");
      Abc_Print(-2,"\t         prints info about unatements of CO funcs in terms of CI vars\n");
      pcVar3 = "yes";
      pcVar2 = "yes";
      if (fComputeAll == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle using efficient computation for all pairs [default = %s]\n",
                pcVar2);
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      pcVar2 = "\t-h     : print the command usage\n";
      iVar1 = -2;
LAB_00277066:
      Abc_Print(iVar1,pcVar2);
      return 1;
    }
    fComputeAll = fComputeAll ^ 1;
  }
  if (pAbc->pGia != (Gia_Man_t *)0x0) {
    Gia_ManCheckUnateTest(pAbc->pGia,fComputeAll,fVerbose);
    return 0;
  }
  pcVar2 = "Abc_CommandAbc9Unate(): There is no AIG.\n";
  iVar1 = -1;
  goto LAB_00277066;
}

Assistant:

int Abc_CommandAbc9Unate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManCheckUnateTest( Gia_Man_t * p, int fComputeAll, int fVerbose );
    int c, fComputeAll = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "avh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fComputeAll ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Unate(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManCheckUnateTest( pAbc->pGia, fComputeAll, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &unate [-avh]\n" );
    Abc_Print( -2, "\t         prints info about unatements of CO funcs in terms of CI vars\n" );
    Abc_Print( -2, "\t-a     : toggle using efficient computation for all pairs [default = %s]\n", fComputeAll? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}